

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O0

void __thiscall uWS::ZlibContext::ZlibContext(ZlibContext *this)

{
  void *pvVar1;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  pvVar1 = malloc(0x4000);
  *(void **)(in_RDI + 0x40) = pvVar1;
  pvVar1 = malloc(0x4000);
  *(void **)(in_RDI + 0x48) = pvVar1;
  return;
}

Assistant:

ZlibContext() {
        deflationBuffer = (char *) malloc(LARGE_BUFFER_SIZE);
        inflationBuffer = (char *) malloc(LARGE_BUFFER_SIZE);
    }